

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O3

void __thiscall
kj::DestructorOnlyDisposer<kj::Vector<unsigned_int>_>::disposeImpl
          (DestructorOnlyDisposer<kj::Vector<unsigned_int>_> *this,void *pointer)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  lVar1 = *pointer;
  if (lVar1 != 0) {
    lVar2 = *(long *)((long)pointer + 8);
    lVar3 = *(long *)((long)pointer + 0x10);
    *(undefined8 *)pointer = 0;
    *(undefined8 *)((long)pointer + 8) = 0;
    *(undefined8 *)((long)pointer + 0x10) = 0;
    (**(code **)**(undefined8 **)((long)pointer + 0x18))
              (*(undefined8 **)((long)pointer + 0x18),lVar1,4,lVar2 - lVar1 >> 2,lVar3 - lVar1 >> 2,
               0);
    return;
  }
  return;
}

Assistant:

void disposeImpl(void* pointer) const override {
    reinterpret_cast<T*>(pointer)->~T();
  }